

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_buffer_free(nk_buffer *b)

{
  void *pvVar1;
  nk_plugin_free UNRECOVERED_JUMPTABLE;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1fd4,"void nk_buffer_free(struct nk_buffer *)");
  }
  pvVar1 = (b->memory).ptr;
  if (((pvVar1 != (void *)0x0) && (b->type != NK_BUFFER_FIXED)) &&
     (UNRECOVERED_JUMPTABLE = (b->pool).free, UNRECOVERED_JUMPTABLE != (nk_plugin_free)0x0)) {
    (*UNRECOVERED_JUMPTABLE)((b->pool).userdata,pvVar1);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_buffer_free(struct nk_buffer *b)
{
    NK_ASSERT(b);
    if (!b || !b->memory.ptr) return;
    if (b->type == NK_BUFFER_FIXED) return;
    if (!b->pool.free) return;
    NK_ASSERT(b->pool.free);
    b->pool.free(b->pool.userdata, b->memory.ptr);
}